

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

int __thiscall Samba::connect(Samba *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  uint uVar2;
  pointer pSVar3;
  Samba *extraout_RAX;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *pEVar4;
  int bps_local;
  Ptr *port_local;
  Samba *this_local;
  
  std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator=
            (&this->_port,
             (unique_ptr<SerialPort,_std::default_delete<SerialPort>_> *)
             CONCAT44(in_register_00000034,__fd));
  pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar3->_vptr_SerialPort[4])();
  this->_isUsb = (bool)((byte)iVar1 & 1);
  if ((this->_isUsb & 1U) != 0) {
    pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    pEVar4 = (EVP_PKEY_CTX *)0xe1000;
    uVar2 = (*pSVar3->_vptr_SerialPort[2])(pSVar3,0xe1000,8,0);
    if (((uVar2 & 1) != 0) && (uVar2 = init(this,pEVar4), (uVar2 & 1) != 0)) {
      if ((this->_debug & 1U) != 0) {
        uVar2 = printf("Connected at 921600 baud\n");
        this = (Samba *)(ulong)uVar2;
      }
      this_local._7_1_ = 1;
      goto LAB_001146bb;
    }
    pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar3->_vptr_SerialPort[3])();
  }
  this->_isUsb = false;
  pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  pEVar4 = (EVP_PKEY_CTX *)((ulong)__addr & 0xffffffff);
  uVar2 = (*pSVar3->_vptr_SerialPort[2])(pSVar3,pEVar4,8,0);
  if (((uVar2 & 1) == 0) || (uVar2 = init(this,pEVar4), (uVar2 & 1) == 0)) {
    disconnect(this);
    this_local._7_1_ = 0;
    this = extraout_RAX;
  }
  else {
    if ((this->_debug & 1U) != 0) {
      uVar2 = printf("Connected at %d baud\n",(ulong)__addr & 0xffffffff);
      this = (Samba *)(ulong)uVar2;
    }
    this_local._7_1_ = 1;
  }
LAB_001146bb:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool
Samba::connect(SerialPort::Ptr port, int bps)
{
    _port = move(port);

    // Try to connect at a high speed if USB
    _isUsb = _port->isUsb();
    if (_isUsb)
    {
        if (_port->open(921600) && init())
        {
            if (_debug)
                printf("Connected at 921600 baud\n");
            return true;
        }
        else
        {
            _port->close();
        }
    }
    _isUsb = false;

    // Try the serial port at slower speed
    if (_port->open(bps) && init())
    {
        if (_debug)
            printf("Connected at %d baud\n", bps);
        return true;
    }

    disconnect();
    return false;
}